

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRF02.h
# Opt level: O3

int GetRangeSRF02(SRF02 *pSRF02,int device,double *pValue)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  int iVar4;
  ssize_t sVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  uchar recvbuf [32];
  timespec local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if ((uint)device < 0x10) {
    iVar1 = *(int *)&pSRF02->I2CBus;
    uVar6 = pSRF02->nbretries;
    uVar2 = pSRF02->timeout;
    lVar7 = 0;
    iVar4 = ioctl(iVar1,0x703,(ulong)pSRF02->addr[(uint)device]);
    iVar9 = 1;
    if (iVar4 == 0) {
      ioctl(iVar1,0x704,0);
      ioctl(iVar1,0x708,0);
      ioctl(iVar1,0x701,(ulong)uVar6);
      ioctl(iVar1,0x702,(ulong)uVar2 / 10);
      uStack_50 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0x5100;
      iVar1 = *(int *)&pSRF02->I2CBus;
      do {
        iVar4 = (int)lVar7;
        sVar5 = write(iVar1,(void *)((long)&local_58 + lVar7),(ulong)(2 - iVar4));
        if ((int)sVar5 < 1) {
          return 1;
        }
        lVar7 = 1;
      } while ((uint)(iVar4 + (int)sVar5) < 2);
      if ((pSRF02->bSaveRawData != 0) && ((FILE *)pSRF02->pfSaveFile != (FILE *)0x0)) {
        fwrite(&local_58,2,1,(FILE *)pSRF02->pfSaveFile);
        fflush((FILE *)pSRF02->pfSaveFile);
      }
      local_78.tv_sec = (__time_t)(pSRF02->RangingDelay / 1000);
      local_78.tv_nsec = (long)((pSRF02->RangingDelay % 1000) * 1000000);
      nanosleep(&local_78,(timespec *)0x0);
      local_58 = 0;
      uStack_50 = 0;
      local_48 = 0;
      uStack_40 = 0;
      sVar5 = write(*(int *)&pSRF02->I2CBus,&local_58,1);
      iVar9 = 1;
      if (0 < (int)sVar5) {
        if ((pSRF02->bSaveRawData != 0) && ((FILE *)pSRF02->pfSaveFile != (FILE *)0x0)) {
          fputc(0,(FILE *)pSRF02->pfSaveFile);
          fflush((FILE *)pSRF02->pfSaveFile);
        }
        local_68 = 0;
        uStack_60 = 0;
        local_78.tv_sec = 0;
        local_78.tv_nsec = 0;
        iVar1 = *(int *)&pSRF02->I2CBus;
        uVar8 = 0;
        do {
          sVar5 = read(iVar1,(void *)((long)&local_78.tv_sec + uVar8),(ulong)(6 - (int)uVar8));
          if ((int)sVar5 < 1) {
            return 1;
          }
          uVar6 = (int)uVar8 + (int)sVar5;
          uVar8 = (ulong)uVar6;
        } while (uVar6 < 6);
        if ((pSRF02->bSaveRawData != 0) && ((FILE *)pSRF02->pfSaveFile != (FILE *)0x0)) {
          fwrite(&local_78,6,1,(FILE *)pSRF02->pfSaveFile);
          fflush((FILE *)pSRF02->pfSaveFile);
        }
        dVar3 = (double)(ushort)(local_78.tv_sec._2_2_ << 8 | local_78.tv_sec._2_2_ >> 8) / 100.0;
        *pValue = dVar3;
        pSRF02->LastRanges[(uint)device] = dVar3;
        iVar9 = 0;
      }
    }
  }
  else {
    puts("Error reading data from a SRF02 : Invalid parameter. ");
    iVar9 = 3;
  }
  return iVar9;
}

Assistant:

inline int GetRangeSRF02(SRF02* pSRF02, int device, double* pValue)
{
	unsigned char sendbuf[MAX_NB_BYTES_SRF02];
	unsigned char recvbuf[MAX_NB_BYTES_SRF02];
	int sendbuflen = 0;
	int recvbuflen = 0;

	if ((device < 0)||(device >= MAX_NB_DEVICES_SRF02))
	{
		printf("Error reading data from a SRF02 : Invalid parameter. \n");
		return EXIT_INVALID_PARAMETER;
	}

	if (SetSlaveComputerI2CBus(pSRF02->I2CBus, pSRF02->addr[device], 0, 0, pSRF02->nbretries, pSRF02->timeout) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)COMMAND_REG_SRF02;
	sendbuf[1] = (unsigned char)REAL_RNG_CM_CMD_SRF02;
	sendbuflen = 2;

	if (WriteAllComputerI2CBus(pSRF02->I2CBus, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pSRF02->bSaveRawData)&&(pSRF02->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSRF02->pfSaveFile);
		fflush(pSRF02->pfSaveFile);
	}

	mSleep(pSRF02->RangingDelay);

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)COMMAND_REG_SRF02;
	sendbuflen = 1;

	if (WriteAllComputerI2CBus(pSRF02->I2CBus, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pSRF02->bSaveRawData)&&(pSRF02->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSRF02->pfSaveFile);
		fflush(pSRF02->pfSaveFile);
	}

	// Prepare the buffer that should receive data from device.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 6;

	if (ReadAllComputerI2CBus(pSRF02->I2CBus, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pSRF02->bSaveRawData)&&(pSRF02->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pSRF02->pfSaveFile);
		fflush(pSRF02->pfSaveFile);
	}

	// Display and analyze received data.
	//printf("Received : \"%s\"\n", recvbuf);
	*pValue = (recvbuf[3] + 256*recvbuf[2])/100.0; // Convert in m.

	pSRF02->LastRanges[device] = *pValue;

	return EXIT_SUCCESS;
}